

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

void __thiscall icu_63::UnifiedCache::handleUnreferencedObject(UnifiedCache *this)

{
  Mutex local_18;
  Mutex lock;
  UnifiedCache *this_local;
  
  lock.fMutex = (UMutex *)this;
  Mutex::Mutex(&local_18,&gCacheMutex);
  this->fNumValuesInUse = this->fNumValuesInUse + -1;
  _runEvictionSlice(this);
  Mutex::~Mutex(&local_18);
  return;
}

Assistant:

void UnifiedCache::handleUnreferencedObject() const {
    Mutex lock(&gCacheMutex);
    --fNumValuesInUse;
    _runEvictionSlice();
}